

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.h
# Opt level: O0

RegSlot __thiscall
Js::AsmJSByteCodeGenerator::GetAndReleaseBinaryLocations<float>
          (AsmJSByteCodeGenerator *this,EmitExpressionInfo *lhs,EmitExpressionInfo *rhs)

{
  bool bVar1;
  RegSlot local_24;
  RegSlot tmpRegToUse;
  EmitExpressionInfo *rhs_local;
  EmitExpressionInfo *lhs_local;
  AsmJSByteCodeGenerator *this_local;
  
  bVar1 = AsmJsFunc::IsTmpLocation<float>(this->mFunction,lhs);
  if (bVar1) {
    local_24 = (lhs->super_EmitInfoBase).location;
    AsmJsFunc::ReleaseLocation<float>(this->mFunction,rhs);
  }
  else {
    bVar1 = AsmJsFunc::IsTmpLocation<float>(this->mFunction,rhs);
    if (bVar1) {
      local_24 = (rhs->super_EmitInfoBase).location;
      AsmJsFunc::ReleaseLocation<float>(this->mFunction,lhs);
    }
    else {
      local_24 = AsmJsFunc::AcquireTmpRegister<float>(this->mFunction);
      AsmJsFunc::ReleaseLocation<float>(this->mFunction,rhs);
      AsmJsFunc::ReleaseLocation<float>(this->mFunction,lhs);
    }
  }
  return local_24;
}

Assistant:

RegSlot GetAndReleaseBinaryLocations( const EmitExpressionInfo* lhs, const EmitExpressionInfo* rhs )
        {
            RegSlot tmpRegToUse;
            if( mFunction->IsTmpLocation<T>( lhs ) )
            {
                tmpRegToUse = lhs->location;
                mFunction->ReleaseLocation<T>( rhs );
            }
            else if( mFunction->IsTmpLocation<T>( rhs ) )
            {
                tmpRegToUse = rhs->location;
                mFunction->ReleaseLocation<T>( lhs );
            }
            else
            {
                tmpRegToUse = mFunction->AcquireTmpRegister<T>();
                mFunction->ReleaseLocation<T>( rhs );
                mFunction->ReleaseLocation<T>( lhs );
            }
            return tmpRegToUse;
        }